

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O3

int __thiscall
beagle::cpu::BeagleCPUImpl<double,_1,_0>::calcEdgeLogLikelihoodsSecondDeriv
          (BeagleCPUImpl<double,_1,_0> *this,int parIndex,int childIndex,int probIndex,
          int firstDerivativeIndex,int secondDerivativeIndex,int categoryWeightsIndex,
          int stateFrequenciesIndex,int scalingFactorsIndex,double *outSumLogLikelihood,
          double *outSumFirstDerivative,double *outSumSecondDerivative)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  int iVar14;
  uint uVar15;
  int iVar16;
  double *pdVar17;
  double **ppdVar18;
  double *pdVar19;
  double *pdVar20;
  double *pdVar21;
  double *pdVar22;
  double *pdVar23;
  int *piVar24;
  double *pdVar25;
  double *pdVar26;
  double *pdVar27;
  long lVar28;
  int iVar29;
  long lVar30;
  int iVar31;
  long lVar32;
  double *pdVar33;
  uint uVar34;
  long lVar35;
  int iVar36;
  ulong uVar37;
  double *pdVar38;
  uint uVar39;
  int iVar40;
  ulong uVar41;
  double __x;
  double dVar42;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [64];
  undefined1 auVar63 [16];
  double local_a8;
  double local_90;
  
  pdVar17 = this->gPartials[parIndex];
  ppdVar18 = this->gTransitionMatrices;
  pdVar19 = ppdVar18[probIndex];
  pdVar20 = ppdVar18[firstDerivativeIndex];
  pdVar21 = ppdVar18[secondDerivativeIndex];
  pdVar22 = this->gStateFrequencies[stateFrequenciesIndex];
  pdVar23 = this->gCategoryWeights[categoryWeightsIndex];
  memset(this->integrationTmp,0,(long)this->kStateCount * (long)this->kPatternCount * 8);
  memset(this->firstDerivTmp,0,(long)this->kStateCount * (long)this->kPatternCount * 8);
  memset(this->secondDerivTmp,0,(long)this->kStateCount * (long)this->kPatternCount * 8);
  if ((childIndex < this->kTipCount) &&
     (piVar24 = this->gTipStates[childIndex], piVar24 != (int *)0x0)) {
    iVar40 = this->kCategoryCount;
    uVar39 = this->kPatternCount;
    if (0 < (long)iVar40) {
      iVar14 = this->kMatrixSize;
      uVar15 = this->kStateCount;
      lVar32 = 0;
      iVar16 = this->kPartialsPaddedStateCount;
      lVar35 = 0;
      iVar29 = 0;
      do {
        if (0 < (int)uVar39) {
          lVar35 = (long)(int)lVar35;
          uVar37 = 0;
          auVar43._8_8_ = 0;
          auVar43._0_8_ = pdVar23[lVar32];
          pdVar33 = this->integrationTmp;
          pdVar25 = this->firstDerivTmp;
          pdVar38 = pdVar17 + lVar35;
          pdVar26 = this->secondDerivTmp;
          iVar36 = this->kTransPaddedStateCount;
          iVar31 = 0;
          do {
            if (0 < (int)uVar15) {
              uVar41 = 0;
              lVar30 = (long)piVar24[uVar37] + (long)iVar29;
              do {
                auVar1._8_8_ = 0;
                auVar1._0_8_ = pdVar33[(long)iVar31 + uVar41];
                auVar49._8_8_ = 0;
                auVar49._0_8_ = pdVar19[lVar30] * pdVar38[uVar41];
                auVar44 = vfmadd213sd_fma(auVar49,auVar43,auVar1);
                pdVar33[(long)iVar31 + uVar41] = auVar44._0_8_;
                auVar2._8_8_ = 0;
                auVar2._0_8_ = pdVar25[(long)iVar31 + uVar41];
                auVar50._8_8_ = 0;
                auVar50._0_8_ = pdVar20[lVar30] * pdVar38[uVar41];
                auVar44 = vfmadd213sd_fma(auVar50,auVar43,auVar2);
                pdVar25[(long)iVar31 + uVar41] = auVar44._0_8_;
                pdVar27 = pdVar21 + lVar30;
                lVar30 = lVar30 + iVar36;
                auVar3._8_8_ = 0;
                auVar3._0_8_ = pdVar26[(long)iVar31 + uVar41];
                auVar51._8_8_ = 0;
                auVar51._0_8_ = *pdVar27 * pdVar38[uVar41];
                auVar44 = vfmadd213sd_fma(auVar51,auVar43,auVar3);
                pdVar26[(long)iVar31 + uVar41] = auVar44._0_8_;
                uVar41 = uVar41 + 1;
              } while (uVar15 != uVar41);
              iVar31 = iVar31 + (int)uVar41;
            }
            lVar35 = lVar35 + iVar16;
            pdVar38 = pdVar38 + iVar16;
            uVar37 = uVar37 + 1;
          } while (uVar37 != uVar39);
        }
        iVar29 = iVar29 + iVar14;
        lVar32 = lVar32 + 1;
      } while (lVar32 != iVar40);
    }
  }
  else {
    iVar40 = this->kCategoryCount;
    uVar39 = this->kPatternCount;
    if (0 < (long)iVar40) {
      uVar15 = this->kStateCount;
      iVar29 = 0;
      lVar35 = 0;
      pdVar38 = this->gPartials[childIndex];
      iVar14 = this->kMatrixSize;
      iVar16 = this->kPartialsPaddedStateCount;
      lVar32 = 0;
      do {
        if (0 < (int)uVar39) {
          lVar35 = (long)(int)lVar35;
          uVar34 = 0;
          auVar44._8_8_ = 0;
          auVar44._0_8_ = pdVar23[lVar32];
          pdVar25 = this->integrationTmp;
          pdVar26 = this->firstDerivTmp;
          pdVar27 = this->secondDerivTmp;
          pdVar33 = pdVar38 + lVar35;
          lVar30 = 0;
          do {
            if (0 < (int)uVar15) {
              lVar30 = (long)(int)lVar30;
              uVar37 = 0;
              iVar36 = iVar29;
              do {
                auVar43 = ZEXT816(0) << 0x40;
                auVar58 = ZEXT816(0) << 0x40;
                auVar53 = ZEXT816(0) << 0x40;
                uVar41 = 0;
                do {
                  auVar63._8_8_ = 0;
                  auVar63._0_8_ = pdVar33[uVar41];
                  auVar4._8_8_ = 0;
                  auVar4._0_8_ = pdVar19[(long)iVar36 + uVar41];
                  auVar53 = vfmadd231sd_fma(auVar53,auVar63,auVar4);
                  auVar5._8_8_ = 0;
                  auVar5._0_8_ = pdVar20[(long)iVar36 + uVar41];
                  auVar58 = vfmadd231sd_fma(auVar58,auVar63,auVar5);
                  auVar6._8_8_ = 0;
                  auVar6._0_8_ = pdVar21[(long)iVar36 + uVar41];
                  auVar43 = vfmadd231sd_fma(auVar43,auVar63,auVar6);
                  uVar41 = uVar41 + 1;
                } while (uVar15 != uVar41);
                iVar36 = iVar36 + uVar15 + 1;
                auVar7._8_8_ = 0;
                auVar7._0_8_ = pdVar25[lVar30];
                auVar61._8_8_ = 0;
                auVar61._0_8_ = auVar53._0_8_ * pdVar17[lVar35 + uVar37];
                auVar53 = vfmadd213sd_fma(auVar61,auVar44,auVar7);
                pdVar25[lVar30] = auVar53._0_8_;
                auVar53._8_8_ = 0;
                auVar53._0_8_ = pdVar26[lVar30];
                auVar59._8_8_ = 0;
                auVar59._0_8_ = auVar58._0_8_ * pdVar17[lVar35 + uVar37];
                auVar53 = vfmadd213sd_fma(auVar59,auVar44,auVar53);
                pdVar26[lVar30] = auVar53._0_8_;
                lVar28 = lVar35 + uVar37;
                uVar37 = uVar37 + 1;
                auVar58._8_8_ = 0;
                auVar58._0_8_ = pdVar27[lVar30];
                auVar52._8_8_ = 0;
                auVar52._0_8_ = auVar43._0_8_ * pdVar17[lVar28];
                auVar53 = vfmadd213sd_fma(auVar52,auVar44,auVar58);
                pdVar27[lVar30] = auVar53._0_8_;
                lVar30 = lVar30 + 1;
              } while (uVar37 != uVar15);
            }
            lVar35 = lVar35 + iVar16;
            pdVar33 = pdVar33 + iVar16;
            uVar34 = uVar34 + 1;
          } while (uVar34 != uVar39);
        }
        lVar32 = lVar32 + 1;
        iVar29 = iVar29 + iVar14;
      } while (lVar32 != iVar40);
    }
  }
  if (0 < (int)uVar39) {
    lVar32 = 0;
    iVar40 = 0;
    do {
      iVar14 = this->kStateCount;
      if ((long)iVar14 < 1) {
        __x = 0.0;
        local_a8 = 0.0;
        local_90 = 0.0;
      }
      else {
        auVar53 = ZEXT816(0);
        auVar62 = ZEXT864(0) << 0x40;
        auVar44 = ZEXT816(0);
        lVar35 = 0;
        do {
          auVar60._8_8_ = 0;
          auVar60._0_8_ = pdVar22[lVar35];
          auVar8._8_8_ = 0;
          auVar8._0_8_ = this->integrationTmp[iVar40 + lVar35];
          auVar44 = vfmadd231sd_fma(auVar44,auVar60,auVar8);
          __x = auVar44._0_8_;
          auVar9._8_8_ = 0;
          auVar9._0_8_ = this->firstDerivTmp[iVar40 + lVar35];
          auVar58 = vfmadd231sd_fma(auVar62._0_16_,auVar60,auVar9);
          auVar62 = ZEXT1664(auVar58);
          auVar10._8_8_ = 0;
          auVar10._0_8_ = this->secondDerivTmp[iVar40 + lVar35];
          auVar53 = vfmadd231sd_fma(auVar53,auVar60,auVar10);
          lVar35 = lVar35 + 1;
        } while (iVar14 != lVar35);
        iVar40 = iVar40 + iVar14;
        local_90 = auVar53._0_8_;
        local_a8 = auVar58._0_8_;
      }
      dVar42 = log(__x);
      auVar54._0_8_ = local_90 / __x;
      auVar54._8_8_ = 0;
      this->outLogLikelihoodsTmp[lVar32] = dVar42;
      auVar45._0_8_ = local_a8 / __x;
      auVar45._8_8_ = 0;
      this->outFirstDerivativesTmp[lVar32] = auVar45._0_8_;
      auVar44 = vfnmadd231sd_fma(auVar54,auVar45,auVar45);
      this->outSecondDerivativesTmp[lVar32] = auVar44._0_8_;
      lVar32 = lVar32 + 1;
      uVar39 = this->kPatternCount;
    } while (lVar32 < (int)uVar39);
  }
  if (scalingFactorsIndex != -1) {
    if ((int)uVar39 < 1) {
      *outSumLogLikelihood = 0.0;
      *outSumFirstDerivative = 0.0;
      *outSumSecondDerivative = 0.0;
      goto LAB_00128738;
    }
    uVar37 = 0;
    pdVar17 = this->gScaleBuffers[scalingFactorsIndex];
    pdVar19 = this->outLogLikelihoodsTmp;
    do {
      pdVar19[uVar37] = pdVar17[uVar37] + pdVar19[uVar37];
      uVar37 = uVar37 + 1;
    } while (uVar39 != uVar37);
  }
  *outSumLogLikelihood = 0.0;
  *outSumFirstDerivative = 0.0;
  *outSumSecondDerivative = 0.0;
  if (0 < (int)uVar39) {
    uVar37 = 0;
    pdVar17 = this->gPatternWeights;
    pdVar19 = this->outLogLikelihoodsTmp;
    pdVar20 = this->outFirstDerivativesTmp;
    pdVar21 = this->outSecondDerivativesTmp;
    do {
      auVar46._8_8_ = 0;
      auVar46._0_8_ = pdVar19[uVar37];
      auVar55._8_8_ = 0;
      auVar55._0_8_ = pdVar17[uVar37];
      auVar11._8_8_ = 0;
      auVar11._0_8_ = *outSumLogLikelihood;
      auVar44 = vfmadd213sd_fma(auVar55,auVar46,auVar11);
      *outSumLogLikelihood = auVar44._0_8_;
      auVar47._8_8_ = 0;
      auVar47._0_8_ = pdVar20[uVar37];
      auVar56._8_8_ = 0;
      auVar56._0_8_ = pdVar17[uVar37];
      auVar12._8_8_ = 0;
      auVar12._0_8_ = *outSumFirstDerivative;
      auVar44 = vfmadd213sd_fma(auVar56,auVar47,auVar12);
      *outSumFirstDerivative = auVar44._0_8_;
      auVar48._8_8_ = 0;
      auVar48._0_8_ = pdVar21[uVar37];
      auVar57._8_8_ = 0;
      auVar57._0_8_ = pdVar17[uVar37];
      uVar37 = uVar37 + 1;
      auVar13._8_8_ = 0;
      auVar13._0_8_ = *outSumSecondDerivative;
      auVar44 = vfmadd213sd_fma(auVar57,auVar48,auVar13);
      *outSumSecondDerivative = auVar44._0_8_;
    } while (uVar39 != uVar37);
  }
LAB_00128738:
  return (uint)(!NAN(*outSumLogLikelihood) && !NAN(*outSumLogLikelihood)) * 8 + -8;
}

Assistant:

BEAGLE_CPU_TEMPLATE
int BeagleCPUImpl<BEAGLE_CPU_GENERIC>::calcEdgeLogLikelihoodsSecondDeriv(const int parIndex,
                                                                         const int childIndex,
                                                                         const int probIndex,
                                                                         const int firstDerivativeIndex,
                                                                         const int secondDerivativeIndex,
                                                                         const int categoryWeightsIndex,
                                                                         const int stateFrequenciesIndex,
                                                                         const int scalingFactorsIndex,
                                                                         double* outSumLogLikelihood,
                                                                         double* outSumFirstDerivative,
                                                                         double* outSumSecondDerivative) {

    assert(parIndex >= kTipCount);

    int returnCode = BEAGLE_SUCCESS;

    const REALTYPE* partialsParent = gPartials[parIndex];
    const REALTYPE* transMatrix = gTransitionMatrices[probIndex];
    const REALTYPE* firstDerivMatrix = gTransitionMatrices[firstDerivativeIndex];
    const REALTYPE* secondDerivMatrix = gTransitionMatrices[secondDerivativeIndex];
    const REALTYPE* wt = gCategoryWeights[categoryWeightsIndex];
    const REALTYPE* freqs = gStateFrequencies[stateFrequenciesIndex];


    memset(integrationTmp, 0, (kPatternCount * kStateCount)*sizeof(REALTYPE));
    memset(firstDerivTmp, 0, (kPatternCount * kStateCount)*sizeof(REALTYPE));
    memset(secondDerivTmp, 0, (kPatternCount * kStateCount)*sizeof(REALTYPE));

    if (childIndex < kTipCount && gTipStates[childIndex]) { // Integrate against a state at the child

        const int* statesChild = gTipStates[childIndex];
        int v = 0; // Index for parent partials

        for(int l = 0; l < kCategoryCount; l++) {
            int u = 0; // Index in resulting product-partials (summed over categories)
            const REALTYPE weight = wt[l];
            for(int k = 0; k < kPatternCount; k++) {

                const int stateChild = statesChild[k];  // DISCUSSION PT: Does it make sense to change the order of the partials,
                // so we can interchange the patterCount and categoryCount loop order?
                int w =  l * kMatrixSize;
                for(int i = 0; i < kStateCount; i++) {
                    integrationTmp[u] += transMatrix[w + stateChild] * partialsParent[v + i] * weight;
                    firstDerivTmp[u] += firstDerivMatrix[w + stateChild] * partialsParent[v + i] * weight;
                    secondDerivTmp[u] += secondDerivMatrix[w + stateChild] * partialsParent[v + i] * weight;
                    u++;

                    w += kTransPaddedStateCount;
                }
                v += kPartialsPaddedStateCount;
            }
        }

    } else { // Integrate against a partial at the child

        const REALTYPE* partialsChild = gPartials[childIndex];
        int v = 0;

        for(int l = 0; l < kCategoryCount; l++) {
            int u = 0;
            const REALTYPE weight = wt[l];
            for(int k = 0; k < kPatternCount; k++) {
                int w = l * kMatrixSize;
                for(int i = 0; i < kStateCount; i++) {
                    double sumOverJ = 0.0;
                    double sumOverJD1 = 0.0;
                    double sumOverJD2 = 0.0;
                    for(int j = 0; j < kStateCount; j++) {
                        sumOverJ += transMatrix[w] * partialsChild[v + j];
                        sumOverJD1 += firstDerivMatrix[w] * partialsChild[v + j];
                        sumOverJD2 += secondDerivMatrix[w] * partialsChild[v + j];
                        w++;
                    }

                    // increment for the extra column at the end
                    w += T_PAD;

                    integrationTmp[u] += sumOverJ * partialsParent[v + i] * weight;
                    firstDerivTmp[u] += sumOverJD1 * partialsParent[v + i] * weight;
                    secondDerivTmp[u] += sumOverJD2 * partialsParent[v + i] * weight;
                    u++;
                }
                v += kPartialsPaddedStateCount;
            }
        }
    }

    int u = 0;
    for(int k = 0; k < kPatternCount; k++) {
        REALTYPE sumOverI = 0.0;
        REALTYPE sumOverID1 = 0.0;
        REALTYPE sumOverID2 = 0.0;
        for(int i = 0; i < kStateCount; i++) {
            sumOverI += freqs[i] * integrationTmp[u];
            sumOverID1 += freqs[i] * firstDerivTmp[u];
            sumOverID2 += freqs[i] * secondDerivTmp[u];
            u++;
        }

        outLogLikelihoodsTmp[k] = log(sumOverI);
        outFirstDerivativesTmp[k] = sumOverID1 / sumOverI;
        outSecondDerivativesTmp[k] = sumOverID2 / sumOverI - outFirstDerivativesTmp[k] * outFirstDerivativesTmp[k];
    }


    if (scalingFactorsIndex != BEAGLE_OP_NONE) {
        const REALTYPE* scalingFactors = gScaleBuffers[scalingFactorsIndex];
        for(int k=0; k < kPatternCount; k++)
            outLogLikelihoodsTmp[k] += scalingFactors[k];
    }

    *outSumLogLikelihood = 0.0;
    *outSumFirstDerivative = 0.0;
    *outSumSecondDerivative = 0.0;
    for (int i = 0; i < kPatternCount; i++) {
        *outSumLogLikelihood += outLogLikelihoodsTmp[i] * gPatternWeights[i];

        *outSumFirstDerivative += outFirstDerivativesTmp[i] * gPatternWeights[i];

        *outSumSecondDerivative += outSecondDerivativesTmp[i] * gPatternWeights[i];
    }

    if (*outSumLogLikelihood != *outSumLogLikelihood)
        returnCode = BEAGLE_ERROR_FLOATING_POINT;

    return returnCode;
}